

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,
                      int writeEndMark,ICompressProgress *progress,ISzAlloc *alloc,
                      ISzAlloc *allocBig)

{
  SRes SVar1;
  SRes SVar2;
  CLzmaEnc *p;
  code *local_38;
  Byte *local_30;
  SizeT local_28;
  int local_20;
  
  local_38 = MyWrite;
  local_28 = *destLen;
  local_20 = 0;
  *(int *)((long)pp + 0x84) = writeEndMark;
  *(code ***)((long)pp + 0xe8) = &local_38;
  *(undefined1 *)((long)pp + 0x123) = 1;
  *(Byte **)((long)pp + 0x140) = src;
  *(SizeT *)((long)pp + 0x160) = srcLen;
  *(undefined4 *)((long)pp + 0x90) = 1;
  local_30 = dest;
  SVar1 = LzmaEnc_AllocAndInit((CLzmaEnc *)pp,0,alloc,allocBig);
  if (SVar1 == 0) {
    SVar1 = LzmaEnc_Encode2((CLzmaEnc *)pp,progress);
    if ((SVar1 == 0) && (SVar1 = 0xb, *(SizeT *)((long)pp + 0x98) == srcLen)) {
      SVar1 = 0;
    }
  }
  *destLen = *destLen - local_28;
  SVar2 = 7;
  if (local_20 == 0) {
    SVar2 = SVar1;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp, Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    int writeEndMark, ICompressProgress *progress, ISzAlloc *alloc, ISzAlloc *allocBig)
{
  SRes res;
  CLzmaEnc *p = (CLzmaEnc *)pp;

  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_MemPrepare(pp, src, srcLen, 0, alloc, allocBig);
  
  if (res == SZ_OK)
  {
    res = LzmaEnc_Encode2(p, progress);
    if (res == SZ_OK && p->nowPos64 != srcLen)
      res = SZ_ERROR_FAIL;
  }

  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}